

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O3

CATNClosure * __thiscall
Centaurus::CompositeATN<wchar_t>::build_closure
          (CATNClosure *__return_storage_ptr__,CompositeATN<wchar_t> *this,CATNClosure *closure)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  ATNStateStack stack;
  ATNStateStack local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var3 = &(closure->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._vptr_ATNPath = (_func_int **)&PTR__ATNPath_001a6a40;
  p_Var2 = (closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      build_closure_inclusive
                (this,__return_storage_ptr__,(ATNPath *)(p_Var2 + 1),p_Var2[2]._M_color,&local_50,
                 (PriorityChain *)&p_Var2[2]._M_parent);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::~vector(&local_50.
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           );
  return __return_storage_ptr__;
}

Assistant:

CATNClosure build_closure(const CATNClosure& closure) const
    {
        CATNClosure ret;

        ATNStateStack stack;

        for (const auto& p : closure)
        {
            build_closure_inclusive(ret, p.path(), p.color(), stack, p.priority());
        }

        return ret;
    }